

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeAddOp4Dup8(Vdbe *p,int op,int p1,int p2,int p3,u8 *zP4,int p4type)

{
  int iVar1;
  char *zP4_00;
  undefined4 in_register_0000000c;
  
  zP4_00 = (char *)sqlite3DbMallocRawNN(p->db,8);
  if (zP4_00 != (char *)0x0) {
    *(undefined8 *)zP4_00 = *(undefined8 *)CONCAT44(in_register_0000000c,p2);
  }
  iVar1 = sqlite3VdbeAddOp4(p,op,0,p1,0,zP4_00,p3);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp4Dup8(
  Vdbe *p,            /* Add the opcode to this VM */
  int op,             /* The new opcode */
  int p1,             /* The P1 operand */
  int p2,             /* The P2 operand */
  int p3,             /* The P3 operand */
  const u8 *zP4,      /* The P4 operand */
  int p4type          /* P4 operand type */
){
  char *p4copy = sqlite3DbMallocRawNN(sqlite3VdbeDb(p), 8);
  if( p4copy ) memcpy(p4copy, zP4, 8);
  return sqlite3VdbeAddOp4(p, op, p1, p2, p3, p4copy, p4type);
}